

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDG2Dot.h
# Opt level: O2

void __thiscall dg::llvmdg::SDG2Dot::dumpEdges(SDG2Dot *this,ostream *out,DGNode *nd)

{
  DGElement *pDVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  
  for (p_Var3 = *(_Rb_tree_node_base **)(nd + 0x30); p_Var3 != (_Rb_tree_node_base *)(nd + 0x20);
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    pDVar1 = *(DGElement **)(p_Var3 + 1);
    poVar2 = std::operator<<(out,"    ");
    operator<<(poVar2,(DGElement *)nd);
    poVar2 = std::operator<<(poVar2," -> ");
    operator<<(poVar2,pDVar1);
    std::operator<<(poVar2,"[style=\"dashed\"]\n");
  }
  for (p_Var3 = *(_Rb_tree_node_base **)(nd + 0x60); p_Var3 != (_Rb_tree_node_base *)(nd + 0x50);
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    pDVar1 = *(DGElement **)(p_Var3 + 1);
    poVar2 = std::operator<<(out,"    ");
    operator<<(poVar2,pDVar1);
    poVar2 = std::operator<<(poVar2," -> ");
    operator<<(poVar2,(DGElement *)nd);
    std::operator<<(poVar2,"[color=red]\n");
  }
  for (p_Var3 = *(_Rb_tree_node_base **)(nd + 0x120); p_Var3 != (_Rb_tree_node_base *)(nd + 0x110);
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    pDVar1 = *(DGElement **)(p_Var3 + 1);
    poVar2 = std::operator<<(out,"    ");
    operator<<(poVar2,(DGElement *)nd);
    poVar2 = std::operator<<(poVar2," -> ");
    operator<<(poVar2,pDVar1);
    std::operator<<(poVar2,"[color=blue]\n");
  }
  return;
}

Assistant:

void dumpEdges(std::ostream &out, sdg::DGNode &nd) const {
        for (auto *use : nd.uses()) {
            out << "    " << nd << " -> " << *use << "[style=\"dashed\"]\n";
        }
        for (auto *def : nd.memdep()) {
            out << "    " << *def << " -> " << nd << "[color=red]\n";
        }
        for (auto *ctrl : nd.controls()) {
            out << "    " << nd << " -> " << *ctrl << "[color=blue]\n";
        }
    }